

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

void __thiscall BigNumber::m_format(BigNumber *this)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (long)(this->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar2 = uVar3 & 0x3fffffffc;
  uVar3 = uVar3 >> 2;
  while( true ) {
    uVar3 = uVar3 - 1;
    uVar2 = uVar2 - 4;
    if (((uVar2 == 0xfffffffffffffffc) ||
        (puVar1 = (this->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start, puVar1[uVar3 & 0xffffffff] != 0)) ||
       ((ulong)((long)(this->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) < 5)) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
               (uint *)((long)puVar1 + uVar2));
  }
  return;
}

Assistant:

void BigNumber::m_format(){
    int i = 0;
    unsigned int m_size = m_degre();
    while((i < m_size) && (m_coef[m_size-1-i] == 0) && m_coef.size() > 1){
        m_coef.erase(m_coef.begin() + m_size-1-i);
        i++;
    }
}